

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O3

EXIT_DATA * new_exit(void)

{
  EXIT_DATA *pEVar1;
  
  if (exit_free == (EXIT_DATA *)0x0) {
    pEVar1 = (EXIT_DATA *)operator_new(0x50);
    (pEVar1->u1).to_room = (ROOM_INDEX_DATA *)0x0;
    pEVar1->exit_info[0] = 0;
    pEVar1->exit_info[1] = 0;
    *(undefined8 *)&pEVar1->key = 0;
    pEVar1->keyword = (char *)0x0;
    pEVar1->description = (char *)0x0;
    pEVar1->next = (EXIT_DATA *)0x0;
    *(undefined8 *)&pEVar1->orig_door = 0;
    pEVar1->rune = (RUNE_DATA *)0x0;
    *(undefined8 *)&pEVar1->has_rune = 0;
    top_exit = top_exit + 1;
  }
  else {
    pEVar1 = exit_free;
    exit_free = exit_free->next;
  }
  (pEVar1->u1).to_room = (ROOM_INDEX_DATA *)0x0;
  pEVar1->next = (EXIT_DATA *)0x0;
  zero_vector(pEVar1->exit_info);
  pEVar1->key = 0;
  pEVar1->keyword = (char *)0x0;
  pEVar1->description = (char *)0x0;
  return pEVar1;
}

Assistant:

EXIT_DATA *new_exit(void)
{
	EXIT_DATA *pExit;

	if (!exit_free)
	{
		pExit = new EXIT_DATA;
		CLEAR_MEM(pExit, sizeof(EXIT_DATA))
		top_exit++;
	}
	else
	{
		pExit = exit_free;
		exit_free = exit_free->next;
	}

	pExit->u1.to_room = nullptr; /* ROM OLC */
	pExit->next = nullptr;
	/*  pExit->vnum         =   0;                        ROM OLC */

	zero_vector(pExit->exit_info);

	pExit->key = 0;
	pExit->keyword = nullptr;
	pExit->description = nullptr;

	return pExit;
}